

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 * GetMatchesSpec1(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                        UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                        UInt32 *distances,UInt32 maxLen)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  UInt32 UVar4;
  UInt32 *pUVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  UInt32 local_5c;
  UInt32 *local_50;
  UInt32 *local_48;
  
  local_50 = son + _cyclicBufferPos * 2;
  local_48 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  uVar8 = pos - curMatch;
  if (uVar8 < _cyclicBufferSize && cutValue != 0) {
    local_5c = maxLen;
    uVar3 = 0;
    uVar6 = 0;
    do {
      UVar4 = 0;
      if (_cyclicBufferPos < uVar8) {
        UVar4 = _cyclicBufferSize;
      }
      uVar1 = uVar3;
      if (uVar6 < uVar3) {
        uVar1 = uVar6;
      }
      uVar2 = (ulong)uVar1;
      pUVar5 = son + (UVar4 + (_cyclicBufferPos - uVar8)) * 2;
      if (cur[uVar2 - uVar8] == cur[uVar2]) {
        uVar7 = uVar1 + 1;
        UVar4 = lenLimit;
        if ((uVar7 != lenLimit) && (UVar4 = uVar7, cur[(ulong)uVar7 - (ulong)uVar8] == cur[uVar7]))
        {
          uVar1 = uVar1 + 2;
          do {
            uVar7 = uVar1;
            UVar4 = lenLimit;
            if (lenLimit == uVar7) break;
            uVar1 = uVar7 + 1;
            UVar4 = uVar7;
          } while (cur[(ulong)uVar7 - (ulong)uVar8] == cur[uVar7]);
        }
        if (local_5c < UVar4) {
          *distances = UVar4;
          distances[1] = uVar8 - 1;
          distances = distances + 2;
          if (UVar4 == lenLimit) {
            *local_50 = *pUVar5;
            UVar4 = pUVar5[1];
            goto LAB_0011468d;
          }
          uVar2 = (ulong)UVar4;
          local_5c = UVar4;
        }
        else {
          uVar2 = (ulong)UVar4;
        }
      }
      if (cur[uVar2 - uVar8] < cur[uVar2]) {
        *local_50 = curMatch;
        pUVar5 = pUVar5 + 1;
        uVar3 = (uint)uVar2;
        local_50 = pUVar5;
      }
      else {
        *local_48 = curMatch;
        uVar6 = (uint)uVar2;
        local_48 = pUVar5;
      }
      cutValue = cutValue - 1;
      if (cutValue == 0) break;
      curMatch = *pUVar5;
      uVar8 = pos - curMatch;
    } while (uVar8 < _cyclicBufferSize);
  }
  *local_50 = 0;
  UVar4 = 0;
LAB_0011468d:
  *local_48 = UVar4;
  return distances;
}

Assistant:

UInt32 * GetMatchesSpec1(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
    UInt32 *distances, UInt32 maxLen)
{
  CLzRef *ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;)
  {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
    {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return distances;
    }
    {
      CLzRef *pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        if (++len != lenLimit && pb[len] == cur[len])
          while (++len != lenLimit)
            if (pb[len] != cur[len])
              break;
        if (maxLen < len)
        {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return distances;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}